

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::LoadImportMetaObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Symbol *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pSVar1 = funcInfo->importMetaSymbol;
  if (pSVar1 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8c4,"(importMetaSym)","importMetaSym");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  Js::ByteCodeWriter::Reg1Unsigned1
            (&this->m_writer,LdImportMeta,pSVar1->location,
             ((this->m_utf8SourceInfo->m_srcInfo).ptr)->moduleID);
  return;
}

Assistant:

void ByteCodeGenerator::LoadImportMetaObject(FuncInfo* funcInfo)
{
    Symbol* importMetaSym = funcInfo->GetImportMetaSymbol();
    Assert(importMetaSym);

    m_writer.Reg1Unsigned1(Js::OpCode::LdImportMeta, importMetaSym->GetLocation(), this->GetModuleID());
}